

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::
     RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
               (Buffer *buffer,int *exp)

{
  bool bVar1;
  char *local_20;
  char *p;
  int *exp_local;
  Buffer *buffer_local;
  
  local_20 = Buffer::back(buffer);
  while( true ) {
    bVar1 = false;
    if ((buffer->begin <= local_20) && (bVar1 = true, *local_20 != '9')) {
      bVar1 = *local_20 == '.';
    }
    if (!bVar1) break;
    if (*local_20 == '9') {
      *local_20 = '0';
    }
    local_20 = local_20 + -1;
  }
  if (local_20 < buffer->begin) {
    *local_20 = '1';
    buffer->begin = local_20;
    std::swap<char>(local_20 + 1,local_20 + 2);
    *exp = *exp + 1;
    Buffer::pop_back(buffer);
  }
  else {
    *local_20 = *local_20 + '\x01';
  }
  return;
}

Assistant:

void RoundUp(Buffer *buffer, int *exp) {
  char *p = &buffer->back();
  while (p >= buffer->begin && (*p == '9' || *p == '.')) {
    if (*p == '9') *p = '0';
    --p;
  }

  if (p < buffer->begin) {
    *p = '1';
    buffer->begin = p;
    if (mode == FormatStyle::Precision) {
      std::swap(p[1], p[2]);  // move the .
      ++*exp;
      buffer->pop_back();
    }
  } else {
    ++*p;
  }
}